

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_status
pugi::impl::anon_unknown_0::load_stream_data_noseek<char>
          (basic_istream<char,_std::char_traits<char>_> *stream,void **out_buffer,size_t *out_size)

{
  xml_stream_chunk<char> *pxVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  xml_stream_chunk<char> *pxVar5;
  undefined8 *local_78;
  xml_stream_chunk<char> *chunk_1;
  char *write;
  char *buffer;
  size_t max_suffix_size;
  xml_stream_chunk<char> *chunk;
  xml_stream_chunk<char> *last;
  size_t total;
  auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<char>_> chunks;
  size_t *out_size_local;
  void **out_buffer_local;
  basic_istream<char,_std::char_traits<char>_> *stream_local;
  
  chunks.deleter = (D)out_size;
  auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<char>_>::auto_deleter
            ((auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<char>_> *)&total,
             (xml_stream_chunk<char> *)0x0,xml_stream_chunk<char>::destroy);
  last = (xml_stream_chunk<char> *)0x0;
  chunk = (xml_stream_chunk<char> *)0x0;
  do {
    bVar2 = std::ios::eof();
    if (((bVar2 ^ 0xff) & 1) == 0) {
      pxVar5 = (xml_stream_chunk<char> *)
               (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)((undefined1 *)((long)&last->next + 1));
      if (pxVar5 == (xml_stream_chunk<char> *)0x0) {
        stream_local._4_4_ = status_out_of_memory;
      }
      else {
        chunk_1 = pxVar5;
        for (local_78 = (undefined8 *)total; local_78 != (undefined8 *)0x0;
            local_78 = (undefined8 *)*local_78) {
          if (last->data + (long)(pxVar5->data + -0x20) < chunk_1->data + local_78[1] + -0x10) {
            __assert_fail("write + chunk->size <= buffer + total",
                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                          ,0x1359,
                          "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = char]"
                         );
          }
          memcpy(chunk_1,local_78 + 2,local_78[1]);
          chunk_1 = (xml_stream_chunk<char> *)(chunk_1->data + local_78[1] + -0x10);
        }
        if (chunk_1 != (xml_stream_chunk<char> *)(last->data + (long)(pxVar5->data + -0x20))) {
          __assert_fail("write == buffer + total",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                        ,0x135e,
                        "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = char]"
                       );
        }
        *out_buffer = pxVar5;
        *(xml_stream_chunk<char> **)chunks.deleter = last;
        stream_local._4_4_ = status_ok;
      }
LAB_005179a7:
      auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<char>_>::~auto_deleter
                ((auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<char>_> *)&total)
      ;
      return stream_local._4_4_;
    }
    pxVar5 = xml_stream_chunk<char>::create();
    if (pxVar5 == (xml_stream_chunk<char> *)0x0) {
      stream_local._4_4_ = status_out_of_memory;
      goto LAB_005179a7;
    }
    pxVar1 = pxVar5;
    if (chunk != (xml_stream_chunk<char> *)0x0) {
      chunk->next = pxVar5;
      pxVar1 = (xml_stream_chunk<char> *)total;
    }
    total = (size_t)pxVar1;
    std::istream::read((char *)stream,(long)pxVar5->data);
    sVar3 = std::istream::gcount();
    pxVar5->size = sVar3;
    uVar4 = std::ios::bad();
    if (((uVar4 & 1) != 0) ||
       ((uVar4 = std::ios::eof(), (uVar4 & 1) == 0 && (uVar4 = std::ios::fail(), (uVar4 & 1) != 0)))
       ) {
      stream_local._4_4_ = status_io_error;
      goto LAB_005179a7;
    }
    if ((xml_stream_chunk<char> *)(last->data + (pxVar5->size - 0x10)) < last) {
      stream_local._4_4_ = status_out_of_memory;
      goto LAB_005179a7;
    }
    last = (xml_stream_chunk<char> *)(last->data + (pxVar5->size - 0x10));
    chunk = pxVar5;
  } while( true );
}

Assistant:

PUGI_IMPL_FN xml_parse_status load_stream_data_noseek(std::basic_istream<T>& stream, void** out_buffer, size_t* out_size)
	{
		auto_deleter<xml_stream_chunk<T> > chunks(0, xml_stream_chunk<T>::destroy);

		// read file to a chunk list
		size_t total = 0;
		xml_stream_chunk<T>* last = 0;

		while (!stream.eof())
		{
			// allocate new chunk
			xml_stream_chunk<T>* chunk = xml_stream_chunk<T>::create();
			if (!chunk) return status_out_of_memory;

			// append chunk to list
			if (last) last = last->next = chunk;
			else chunks.data = last = chunk;

			// read data to chunk
			stream.read(chunk->data, static_cast<std::streamsize>(sizeof(chunk->data) / sizeof(T)));
			chunk->size = static_cast<size_t>(stream.gcount()) * sizeof(T);

			// read may set failbit | eofbit in case gcount() is less than read length, so check for other I/O errors
			if (stream.bad() || (!stream.eof() && stream.fail())) return status_io_error;

			// guard against huge files (chunk size is small enough to make this overflow check work)
			if (total + chunk->size < total) return status_out_of_memory;
			total += chunk->size;
		}

		size_t max_suffix_size = sizeof(char_t);

		// copy chunk list to a contiguous buffer
		char* buffer = static_cast<char*>(xml_memory::allocate(total + max_suffix_size));
		if (!buffer) return status_out_of_memory;

		char* write = buffer;

		for (xml_stream_chunk<T>* chunk = chunks.data; chunk; chunk = chunk->next)
		{
			assert(write + chunk->size <= buffer + total);
			memcpy(write, chunk->data, chunk->size);
			write += chunk->size;
		}

		assert(write == buffer + total);

		// return buffer
		*out_buffer = buffer;
		*out_size = total;

		return status_ok;
	}